

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerEpoll.cpp
# Opt level: O0

void __thiscall
Liby::PollerEpoll::updateChanel(PollerEpoll *this,Channel *ch,bool readable,bool writable)

{
  int iVar1;
  undefined8 *puVar2;
  int *piVar3;
  char *pcVar4;
  bool bVar5;
  undefined1 local_2c [4];
  int ret;
  epoll_event event;
  int fd;
  bool writable_local;
  bool readable_local;
  Channel *ch_local;
  PollerEpoll *this_local;
  
  bVar5 = false;
  event.data.u64._6_1_ = writable;
  event.data.u64._7_1_ = readable;
  if (ch != (Channel *)0x0) {
    iVar1 = Channel::get_fd(ch);
    bVar5 = -1 < iVar1;
  }
  if (!bVar5) {
    __assert_fail("ch && ch->get_fd() >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerEpoll.cpp"
                  ,0x5a,"virtual void Liby::PollerEpoll::updateChanel(Channel *, bool, bool)");
  }
  ret = Channel::get_fd(ch);
  local_2c = (undefined1  [4])0x2010;
  if ((event.data.u64._7_1_ & 1) != 0) {
    local_2c = (undefined1  [4])0x2011;
  }
  if ((event.data.u64._6_1_ & 1) != 0) {
    local_2c = (undefined1  [4])((uint)local_2c | 4);
  }
  event.data.fd = ret;
  iVar1 = epoll_ctl(this->pollerfd_,3,ret,(epoll_event *)local_2c);
  if (iVar1 < 0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    *puVar2 = pcVar4;
    __cxa_throw(puVar2,&char*::typeinfo,0);
  }
  return;
}

Assistant:

void PollerEpoll::updateChanel(Channel *ch, bool readable, bool writable) {
    assert(ch && ch->get_fd() >= 0);

    int fd = ch->get_fd();
    struct epoll_event event;
    event.data.fd = fd;
    event.events = EPOLLHUP | EPOLLRDHUP;

    if (readable) {
        event.events |= EPOLLIN;
    }

    if (writable) {
        event.events |= EPOLLOUT;
    }

    int ret = ::epoll_ctl(pollerfd_, EPOLL_CTL_MOD, fd, &event);

    if (ret < 0) {
        throw ::strerror(errno);
    }
}